

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O2

size_t FSE_buildDTable_raw(FSE_DTable *dt,uint nbBits)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  
  if (nbBits == 0) {
    sVar1 = 0xffffffffffffffff;
  }
  else {
    *(short *)dt = (short)nbBits;
    *(undefined2 *)((long)dt + 2) = 1;
    sVar1 = 0;
    for (uVar2 = 0; uVar2 >> ((byte)nbBits & 0x1f) == 0; uVar2 = uVar2 + 1) {
      uVar3 = (ulong)uVar2;
      *(undefined2 *)(dt + uVar3 + 1) = 0;
      *(char *)((long)dt + uVar3 * 4 + 6) = (char)uVar2;
      *(byte *)((long)dt + uVar3 * 4 + 7) = (byte)nbBits;
    }
  }
  return sVar1;
}

Assistant:

size_t FSE_buildDTable_raw (FSE_DTable* dt, unsigned nbBits)
{
    void* ptr = dt;
    FSE_DTableHeader* const DTableH = (FSE_DTableHeader*)ptr;
    void* dPtr = dt + 1;
    FSE_decode_t* const dinfo = (FSE_decode_t*)dPtr;
    const unsigned tableSize = 1 << nbBits;
    const unsigned tableMask = tableSize - 1;
    const unsigned maxSV1 = tableMask+1;
    unsigned s;

    /* Sanity checks */
    if (nbBits < 1) return ERROR(GENERIC);         /* min size */

    /* Build Decoding Table */
    DTableH->tableLog = (U16)nbBits;
    DTableH->fastMode = 1;
    for (s=0; s<maxSV1; s++) {
        dinfo[s].newState = 0;
        dinfo[s].symbol = (BYTE)s;
        dinfo[s].nbBits = (BYTE)nbBits;
    }

    return 0;
}